

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O1

bool cmCreateTestSourceList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_type *psVar1;
  char *__s;
  cmMakefile *this;
  pointer pcVar2;
  size_type sVar3;
  int iVar4;
  string *psVar5;
  undefined8 *puVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  long *plVar8;
  cmSourceFile *pcVar9;
  ulong *puVar10;
  value_type *__x;
  pointer pbVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string *psVar15;
  bool bVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string sourceListValue;
  string local_1e8;
  string configFile;
  string functionMapCode;
  string local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  string local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  cmNewLineStyle local_10c;
  string forwardDeclareCode;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string function;
  string extraInclude;
  string driver;
  
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)__x) < 0x41) {
    configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&configFile,"called with wrong number of arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configFile._M_dataplus._M_p != &configFile.field_2) {
      operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
    }
    bVar16 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_150 = args;
    if (__x != (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        iVar4 = std::__cxx11::string::compare((char *)__x);
        if (iVar4 == 0) {
          if (__x + 1 ==
              (local_150->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&configFile,"incorrect arguments to EXTRA_INCLUDE","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002d249d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)configFile._M_dataplus._M_p == &configFile.field_2) goto LAB_002d189e;
            goto LAB_002d1891;
          }
          configFile.field_2._8_8_ = __x[1]._M_dataplus._M_p;
          configFile.field_2._M_allocated_capacity = __x[1]._M_string_length;
          configFile._M_dataplus._M_p = (pointer)0xa;
          configFile._M_string_length = (size_type)anon_var_dwarf_572737;
          views._M_len = 3;
          views._M_array = (iterator)&configFile;
          cmCatViews_abi_cxx11_(&forwardDeclareCode,views);
          psVar5 = &extraInclude;
LAB_002d17c2:
          __x = __x + 1;
          std::__cxx11::string::operator=((string *)psVar5,(string *)&forwardDeclareCode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)forwardDeclareCode._M_dataplus._M_p != &forwardDeclareCode.field_2) {
            operator_delete(forwardDeclareCode._M_dataplus._M_p,
                            CONCAT71(forwardDeclareCode.field_2._M_allocated_capacity._1_7_,
                                     forwardDeclareCode.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)__x);
          if (iVar4 == 0) {
            if (__x + 1 ==
                (local_150->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&configFile,"incorrect arguments to FUNCTION","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002d249d;
            }
            configFile._M_string_length = (size_type)__x[1]._M_dataplus._M_p;
            configFile._M_dataplus._M_p = (pointer)__x[1]._M_string_length;
            configFile.field_2._M_allocated_capacity = 0xc;
            configFile.field_2._8_8_ = anon_var_dwarf_c2482c;
            views_00._M_len = 2;
            views_00._M_array = (iterator)&configFile;
            cmCatViews_abi_cxx11_(&forwardDeclareCode,views_00);
            psVar5 = &function;
            goto LAB_002d17c2;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests,__x);
        }
        __x = __x + 1;
      } while (__x != (local_150->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar11 = tests.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __s = ((tests.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&configFile,
               tests.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar3 = configFile._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configFile._M_dataplus._M_p != &configFile.field_2) {
      operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
    }
    if (sVar3 < 2) {
      configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&configFile,"You must specify a file extension for the test driver file."
                 ,"");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)configFile._M_dataplus._M_p != &configFile.field_2) {
LAB_002d1891:
        operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
      }
LAB_002d189e:
      bVar16 = false;
    }
    else {
      this = status->Makefile;
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      configFile._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
      configFile._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
      configFile.field_2._8_8_ = &forwardDeclareCode.field_2;
      forwardDeclareCode._M_dataplus._M_p = &DAT_00000001;
      forwardDeclareCode.field_2._M_local_buf[0] = '/';
      configFile.field_2._M_allocated_capacity = 1;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&configFile;
      forwardDeclareCode._M_string_length = configFile.field_2._8_8_;
      cmCatViews_abi_cxx11_(&driver,views_01);
      psVar5 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
      pcVar2 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&configFile,pcVar2,pcVar2 + psVar5->_M_string_length);
      std::__cxx11::string::append((char *)&configFile);
      psVar5 = pbVar11 + 2;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      if (psVar5 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        psVar15 = psVar5;
        do {
          paVar14 = &local_1e8.field_2;
          iVar4 = std::__cxx11::string::compare((char *)psVar15);
          if (iVar4 == 0) break;
          functionMapCode._M_string_length = 0;
          functionMapCode.field_2._M_local_buf[0] = '\0';
          functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
          cmsys::SystemTools::GetFilenamePath(&sourceListValue,psVar15);
          sVar3 = sourceListValue._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (sVar3 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,psVar15);
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
              operator_delete(sourceListValue._M_dataplus._M_p,
                              sourceListValue.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_170,psVar15);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
            puVar10 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_1e8.field_2._M_allocated_capacity = *puVar10;
              local_1e8.field_2._8_8_ = puVar6[3];
              local_1e8._M_dataplus._M_p = (pointer)paVar14;
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar10;
              local_1e8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1e8._M_string_length = puVar6[1];
            *puVar6 = puVar10;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_148,psVar15);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != paVar14) {
              uVar12 = local_1e8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_148._M_string_length + local_1e8._M_string_length) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                uVar12 = local_148.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_148._M_string_length + local_1e8._M_string_length)
              goto LAB_002d1b03;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_148,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p)
              ;
            }
            else {
LAB_002d1b03:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1e8,(ulong)local_148._M_dataplus._M_p);
            }
            psVar1 = puVar6 + 2;
            if ((size_type *)*puVar6 == psVar1) {
              sourceListValue.field_2._M_allocated_capacity = *psVar1;
              sourceListValue.field_2._8_8_ = puVar6[3];
              sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
            }
            else {
              sourceListValue.field_2._M_allocated_capacity = *psVar1;
              sourceListValue._M_dataplus._M_p = (pointer)*puVar6;
            }
            sourceListValue._M_string_length = puVar6[1];
            *puVar6 = psVar1;
            puVar6[1] = 0;
            *(char *)psVar1 = '\0';
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
              operator_delete(sourceListValue._M_dataplus._M_p,
                              sourceListValue.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != paVar14) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
          cmsys::SystemTools::MakeCidentifier(&sourceListValue,&functionMapCode);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (tests_func_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             tests_func_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&functionMapCode);
          pbVar11 = tests_func_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests_func_name,&functionMapCode);
          if (_Var7._M_current == pbVar11) {
            std::__cxx11::string::append((char *)&forwardDeclareCode);
            std::__cxx11::string::_M_append
                      ((char *)&forwardDeclareCode,(ulong)functionMapCode._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&forwardDeclareCode);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)functionMapCode._M_dataplus._M_p != &functionMapCode.field_2) {
            operator_delete(functionMapCode._M_dataplus._M_p,
                            CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                     functionMapCode.field_2._M_local_buf[0]) + 1);
          }
          psVar15 = psVar15 + 1;
        } while (psVar15 !=
                 tests.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
      functionMapCode._M_string_length = 0;
      functionMapCode.field_2._M_local_buf[0] = '\0';
      if (psVar5 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar15 = psVar5;
        do {
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          sourceListValue._M_string_length = 0;
          sourceListValue.field_2._M_allocated_capacity =
               sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
          cmsys::SystemTools::GetFilenamePath(&local_1e8,psVar15);
          sVar3 = local_1e8._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (sVar3 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1e8,psVar15);
            std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1e8);
            uVar12 = local_1e8.field_2._M_allocated_capacity;
            _Var13._M_p = local_1e8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) goto LAB_002d1f79;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_148,psVar15);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_148);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            puVar10 = (ulong *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_170.field_2._M_allocated_capacity = *puVar10;
              local_170.field_2._8_8_ = plVar8[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *puVar10;
              local_170._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_170._M_string_length = plVar8[1];
            *plVar8 = (long)puVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_d8,psVar15);
            uVar12 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              uVar12 = local_170.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar12 < local_d8._M_string_length + local_170._M_string_length) {
              uVar12 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar12 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar12 < local_d8._M_string_length + local_170._M_string_length)
              goto LAB_002d1e7b;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_d8,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p);
            }
            else {
LAB_002d1e7b:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_170,(ulong)local_d8._M_dataplus._M_p);
            }
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            puVar10 = puVar6 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_1e8.field_2._M_allocated_capacity = *puVar10;
              local_1e8.field_2._8_8_ = puVar6[3];
            }
            else {
              local_1e8.field_2._M_allocated_capacity = *puVar10;
              local_1e8._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1e8._M_string_length = puVar6[1];
            *puVar6 = puVar10;
            puVar6[1] = 0;
            *(undefined1 *)puVar10 = 0;
            std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            uVar12 = local_148.field_2._M_allocated_capacity;
            _Var13._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
LAB_002d1f79:
              operator_delete(_Var13._M_p,uVar12 + 1);
            }
          }
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)sourceListValue._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)(pbVar11->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          psVar15 = psVar15 + 1;
          pbVar11 = pbVar11 + 1;
        } while (psVar15 !=
                 tests.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (extraInclude._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        value._M_str = extraInclude._M_dataplus._M_p;
        value._M_len = extraInclude._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      if (function._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        value_00._M_str = function._M_dataplus._M_p;
        value_00._M_len = function._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      paVar14 = &sourceListValue.field_2;
      sourceListValue._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS","");
      value_01._M_str = forwardDeclareCode._M_dataplus._M_p;
      value_01._M_len = forwardDeclareCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != paVar14) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      sourceListValue._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTRIES","");
      value_02._M_str = functionMapCode._M_dataplus._M_p;
      value_02._M_len = functionMapCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != paVar14) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      cmNewLineStyle::cmNewLineStyle(&local_10c);
      iVar4 = cmMakefile::ConfigureFile(this,&configFile,&driver,false,true,false,0,local_10c);
      bVar16 = iVar4 != 0;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_allocated_capacity =
           sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
      sourceListValue._M_dataplus._M_p = (pointer)paVar14;
      pcVar9 = cmMakefile::GetOrCreateSource(this,&driver,false,Ambiguous);
      paVar14 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar9,&local_1e8,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      if (psVar5 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar9 = cmMakefile::GetOrCreateSource(this,psVar5,false,Ambiguous);
          local_1e8._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar9,&local_1e8,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != paVar14) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&sourceListValue);
          std::__cxx11::string::_M_append
                    ((char *)&sourceListValue,(ulong)(psVar5->_M_dataplus)._M_p);
          psVar5 = psVar5 + 1;
        } while (psVar5 != tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,__s,(allocator<char> *)&local_170);
      value_03._M_str = sourceListValue._M_dataplus._M_p;
      value_03._M_len = sourceListValue._M_string_length;
      cmMakefile::AddDefinition(this,&local_1e8,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)functionMapCode._M_dataplus._M_p != &functionMapCode.field_2) {
        operator_delete(functionMapCode._M_dataplus._M_p,
                        CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                 functionMapCode.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)forwardDeclareCode._M_dataplus._M_p != &forwardDeclareCode.field_2) {
        operator_delete(forwardDeclareCode._M_dataplus._M_p,
                        CONCAT71(forwardDeclareCode.field_2._M_allocated_capacity._1_7_,
                                 forwardDeclareCode.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)configFile._M_dataplus._M_p != &configFile.field_2) {
        operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)driver._M_dataplus._M_p != &driver.field_2) {
        operator_delete(driver._M_dataplus._M_p,driver.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)function._M_dataplus._M_p != &function.field_2) {
      operator_delete(function._M_dataplus._M_p,
                      CONCAT71(function.field_2._M_allocated_capacity._1_7_,
                               function.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)extraInclude._M_dataplus._M_p != &extraInclude.field_2) {
      operator_delete(extraInclude._M_dataplus._M_p,
                      CONCAT71(extraInclude.field_2._M_allocated_capacity._1_7_,
                               extraInclude.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar16;
}

Assistant:

bool cmCreateTestSourceList(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  auto i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = cmStrCat("#include \"", *i, "\"\n");
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = cmStrCat(*i, "(&ac, &av);\n");
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    status.SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  std::string driver = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', *i);
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  auto testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    func_name = cmSystemTools::MakeCidentifier(func_name);
    bool already_declared =
      std::find(tests_func_name.begin(), tests_func_name.end(), func_name) !=
      tests_func_name.end();
    tests_func_name.push_back(func_name);
    if (!already_declared) {
      forwardDeclareCode += "int ";
      forwardDeclareCode += func_name;
      forwardDeclareCode += "(int, char*[]);\n";
    }
  }

  std::string functionMapCode;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
  }
  if (!extraInclude.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES", extraInclude);
  }
  if (!function.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION", function);
  }
  mf.AddDefinition("CMAKE_FORWARD_DECLARE_TESTS", forwardDeclareCode);
  mf.AddDefinition("CMAKE_FUNCTION_TABLE_ENTRIES", functionMapCode);
  bool res = true;
  if (!mf.ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = mf.GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = mf.GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  mf.AddDefinition(sourceList, sourceListValue);
  return res;
}